

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O3

void __thiscall InterpTest::Instantiate(InterpTest *this,RefVec *imports)

{
  Store *this_00;
  Store *pSVar1;
  pointer pcVar2;
  bool bVar3;
  Ref *pRVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  Ptr local_1c8;
  RefPtr<wabt::interp::Module> local_1a8;
  AssertHelper local_188;
  internal local_180 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  string local_170;
  ModuleDesc local_150;
  
  this_00 = &this->store_;
  std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
            (&local_150.func_types,&(this->module_desc_).func_types);
  std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
            (&local_150.imports,&(this->module_desc_).imports);
  std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
            (&local_150.funcs,&(this->module_desc_).funcs);
  std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
            (&local_150.tables,&(this->module_desc_).tables);
  std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
            (&local_150.memories,&(this->module_desc_).memories);
  std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
            (&local_150.globals,&(this->module_desc_).globals);
  std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::vector
            (&local_150.events,&(this->module_desc_).events);
  std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
            (&local_150.exports,&(this->module_desc_).exports);
  std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
            (&local_150.starts,&(this->module_desc_).starts);
  std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
            (&local_150.elems,&(this->module_desc_).elems);
  std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
            (&local_150.datas,&(this->module_desc_).datas);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_150.istream.data_,&(this->module_desc_).istream.data_);
  wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
            (&local_1a8,this_00,this_00,&local_150);
  (this->mod_).obj_ = local_1a8.obj_;
  (this->mod_).store_ = local_1a8.store_;
  (this->mod_).root_index_ = local_1a8.root_index_;
  local_1a8.root_index_ = 0;
  local_1a8.obj_ = (Module *)0x0;
  local_1a8.store_ = (Store *)0x0;
  wabt::interp::ModuleDesc::~ModuleDesc(&local_150);
  local_1c8.root_index_ = 0;
  local_1c8.obj_ = (Trap *)0x0;
  local_1c8.store_ = (Store *)0x0;
  pSVar1 = (this->mod_).store_;
  if (pSVar1 == (Store *)0x0) {
    pRVar4 = (Ref *)&wabt::interp::Ref::Null;
  }
  else {
    pRVar4 = wabt::interp::FreeList<wabt::interp::Ref>::Get
                       (&pSVar1->roots_,(this->mod_).root_index_);
  }
  wabt::interp::Instance::Instantiate
            ((Ptr *)&local_1a8,this_00,(Ref)pRVar4->index,imports,&local_1c8);
  (this->inst_).obj_ = (Instance *)local_1a8.obj_;
  (this->inst_).store_ = local_1a8.store_;
  (this->inst_).root_index_ = local_1a8.root_index_;
  local_180[0] = (internal)(local_1a8.obj_ != (Module *)0x0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.obj_ == (Module *)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    pcVar2 = ((local_1c8.obj_)->message_)._M_dataplus._M_p;
    local_1a8.obj_ = (Module *)&local_1a8.root_index_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar2,pcVar2 + ((local_1c8.obj_)->message_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1d0.ptr_ + 0x10),(char *)local_1a8.obj_,(long)local_1a8.store_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,local_180,(AssertionResult *)"inst_","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x2b,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_1a8.obj_ != (Module *)&local_1a8.root_index_) {
      operator_delete(local_1a8.obj_);
    }
    if (local_1d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_1d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1d0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_1c8.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_1c8.store_,local_1c8.root_index_);
  }
  return;
}

Assistant:

void Instantiate(const RefVec& imports = RefVec{}) {
    mod_ = Module::New(store_, module_desc_);
    RefPtr<Trap> trap;
    inst_ = Instance::Instantiate(store_, mod_.ref(), imports, &trap);
    ASSERT_TRUE(inst_) << trap->message();
  }